

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.c
# Opt level: O1

apx_error_t
apx_vm_deserializer_unpack_byte
          (apx_vm_deserializer_t *self,uint32_t array_length,apx_sizeType_t dynamic_size_type)

{
  apx_error_t aVar1;
  
  if (self == (apx_vm_deserializer_t *)0x0) {
    aVar1 = 1;
  }
  else {
    if (self->state == (apx_vm_readState_t *)0x0) {
      __assert_fail("self->state != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/deserializer.c"
                    ,0x17d,
                    "apx_error_t apx_vm_deserializer_unpack_byte(apx_vm_deserializer_t *, uint32_t, apx_sizeType_t)"
                   );
    }
    aVar1 = deserializer_prepare_for_buffer_read(self,'\x0e',1);
    if (aVar1 == 0) {
      aVar1 = deserializer_unpack_value(self,array_length,dynamic_size_type);
      return aVar1;
    }
  }
  return aVar1;
}

Assistant:

apx_error_t apx_vm_deserializer_unpack_byte(apx_vm_deserializer_t* self, uint32_t array_length, apx_sizeType_t dynamic_size_type)
{
   if (self != NULL)
   {
      assert(self->state != NULL);
      apx_error_t result = deserializer_prepare_for_buffer_read(self, APX_TYPE_CODE_BYTE, BYTE_SIZE);
      if (result != APX_NO_ERROR)
      {
         return result;
      }
      return deserializer_unpack_value(self, array_length, dynamic_size_type);
   }
   return APX_INVALID_ARGUMENT_ERROR;
}